

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
          (dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *this)

{
  bool bVar1;
  iterator pvVar2;
  char *local_20;
  iterator p;
  dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *pdStack_10;
  allocator_type my_alloc;
  dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *this_local;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_003720e8;
  pdStack_10 = this;
  bVar1 = empty(this);
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_20 = begin(this);
    while( true ) {
      pvVar2 = end(this);
      if (local_20 == pvVar2) break;
      std::allocator_traits<std::allocator<char>_>::destroy<char>
                ((allocator_type *)((long)&p + 7),local_20);
      local_20 = local_20 + 1;
    }
    std::allocator_traits<std::allocator<char>_>::deallocate
              ((allocator_type *)((long)&p + 7),this->elems,(ulong)this->elem_count);
  }
  return;
}

Assistant:

virtual ~dynamic_array()
    {
      if(!empty())
      {
        using local_allocator_traits_type = std::allocator_traits<allocator_type>;

        allocator_type my_alloc;

        auto p = begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(p != end())
        {
          local_allocator_traits_type::destroy(my_alloc, p);

          ++p;
        }

        // Destroy the elements and deallocate the range.
        local_allocator_traits_type::deallocate(my_alloc, elems, elem_count);
      }
    }